

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysc_module_free(lysf_ctx *ctx,lysc_module *module)

{
  lysc_node *plVar1;
  lysc_node_action *plVar2;
  lysc_node_notif *plVar3;
  lysc_ext_instance *plVar4;
  lysc_node *node;
  lysc_node_action *node_00;
  lysc_node_notif *node_01;
  void *pvVar5;
  long lVar6;
  
  if (module == (lysc_module *)0x0) {
    return;
  }
  node = module->data;
  while (node != (lysc_node *)0x0) {
    plVar1 = node->next;
    lysc_node_free_(ctx,node);
    node = plVar1;
  }
  node_00 = module->rpcs;
  while (node_00 != (lysc_node_action *)0x0) {
    plVar2 = (lysc_node_action *)(node_00->field_0).node.next;
    lysc_node_free_(ctx,(lysc_node *)node_00);
    node_00 = plVar2;
  }
  node_01 = module->notifs;
  while (node_01 != (lysc_node_notif *)0x0) {
    plVar3 = (lysc_node_notif *)(node_01->field_0).node.next;
    lysc_node_free_(ctx,(lysc_node *)node_01);
    node_01 = plVar3;
  }
  lVar6 = 0;
  pvVar5 = (void *)0x0;
  do {
    plVar4 = module->exts;
    if (plVar4 == (lysc_ext_instance *)0x0) {
LAB_0015a1ca:
      free(module);
      return;
    }
    if (plVar4[-1].compiled <= pvVar5) {
      free(&plVar4[-1].compiled);
      goto LAB_0015a1ca;
    }
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar4->def + lVar6));
    pvVar5 = (void *)((long)pvVar5 + 1);
    lVar6 = lVar6 + 0x48;
  } while( true );
}

Assistant:

void
lysc_module_free(struct lysf_ctx *ctx, struct lysc_module *module)
{
    struct lysc_node *node, *node_next;

    if (!module) {
        return;
    }

    LY_LIST_FOR_SAFE(module->data, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)module->rpcs, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    LY_LIST_FOR_SAFE((struct lysc_node *)module->notifs, node_next, node) {
        lysc_node_free_(ctx, node);
    }
    FREE_ARRAY(ctx, module->exts, lysc_ext_instance_free);

    free(module);
}